

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>::iterator,_bool>
* __thiscall
phmap::priv::
raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::DecomposeHash,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentEqIntOverload,std::allocator<int>>
::InsertSlot<true>::operator()
          (pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>::iterator,_bool>
           *__return_storage_ptr__,void *this,DecomposeType *key,DecomposeType *param_2)

{
  raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>
  *this_00;
  unsigned_long i;
  ctrl_t h;
  allocator_type *paVar1;
  pair<unsigned_long,_bool> pVar2;
  iterator local_58;
  unsigned_long local_48;
  undefined1 local_40;
  unsigned_long local_38;
  pair<unsigned_long,_bool> res;
  size_t hashval;
  DecomposeType *param_2_local;
  DecomposeType *key_local;
  InsertSlot<true> *this_local;
  
  res._8_8_ = raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>
              ::hash<phmap::priv::(anonymous_namespace)::DecomposeType>(*this,key);
  pVar2 = raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>
          ::find_or_prepare_insert<phmap::priv::(anonymous_namespace)::DecomposeType>
                    (*this,key,res._8_8_);
  local_48 = pVar2.first;
  local_40 = pVar2.second;
  local_38 = local_48;
  res.first._0_1_ = local_40;
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    paVar1 = raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>
             ::alloc_ref(*this);
    hash_policy_traits<phmap::priv::(anonymous_namespace)::DecomposePolicy,void>::
    destroy<std::allocator<int>>(paVar1,*(slot_type **)((long)this + 8));
  }
  else {
    paVar1 = raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>
             ::alloc_ref(*this);
    hash_policy_traits<phmap::priv::(anonymous_namespace)::DecomposePolicy,void>::
    transfer<std::allocator<int>>
              (paVar1,(slot_type *)(*(long *)(*this + 8) + local_38 * 4),
               *(slot_type **)((long)this + 8));
    i = local_38;
    this_00 = *this;
    h = H2(res._8_8_);
    raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>
    ::set_ctrl(this_00,i,h);
  }
  local_58 = raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>
             ::iterator_at(*this,local_38);
  std::
  pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>::iterator,_bool>
  ::
  pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>::iterator,_bool_&,_true>
            (__return_storage_ptr__,&local_58,(bool *)&res);
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> operator()(const K& key, Args&&...) && {
            size_t hashval = s.hash(key);
            auto res = s.find_or_prepare_insert(key, hashval);
            if (res.second) {
                PolicyTraits::transfer(&s.alloc_ref(), s.slots_ + res.first, &slot);
                s.set_ctrl(res.first, H2(hashval));
            } else if (do_destroy) {
                PolicyTraits::destroy(&s.alloc_ref(), &slot);
            }
            return {s.iterator_at(res.first), res.second};
        }